

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Widget::~Widget(Widget *this)

{
  ~Widget((Widget *)&this[-1].field_0x20);
  return;
}

Assistant:

Q_OBJECT

public:
	Widget()
		:	edit( 0 )
	{
		QHBoxLayout * l = new QHBoxLayout( this );

		edit = new QLineEdit( this );
		edit->setReadOnly( true );

		l->addWidget( edit );

		QtMWidgets::Stepper * s = new QtMWidgets::Stepper( this );

		s->setWrapping( true );

		edit->setText( QString::number( s->value() ) );

		l->addWidget( s );

		connect( s, &QtMWidgets::Stepper::valueChanged,
			this, &Widget::valueChanged );
	}